

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

Node * __thiscall
TMap<cvertex_t,_int,_THashTraits<cvertex_t>,_TValueTraits<int>_>::FindKey
          (TMap<cvertex_t,_int,_THashTraits<cvertex_t>,_TValueTraits<int>_> *this,cvertex_t key)

{
  Node *pNVar1;
  Node *pNVar2;
  
  pNVar1 = this->Nodes +
           (this->Size - 1 &
           SUB84(key.Y + 6755399441055744.0,0) * 0x10000 + SUB84(key.X + 6755399441055744.0,0));
  while( true ) {
    pNVar2 = pNVar1;
    if (pNVar2 == (Node *)0x0) {
      return (Node *)0x0;
    }
    pNVar1 = pNVar2->Next;
    if (pNVar1 == (Node *)0x1) break;
    if ((ABS((pNVar2->Pair).Key.X - key.X) < 1.52587890625e-05) &&
       (ABS((pNVar2->Pair).Key.Y - key.Y) < 1.52587890625e-05)) {
      return pNVar2;
    }
  }
  return (Node *)0x0;
}

Assistant:

Node *FindKey(const KT key)
	{
		HashTraits Traits;
		Node *n = MainPosition(key);
		while (n != NULL && !n->IsNil() && Traits.Compare(n->Pair.Key, key))
		{
			n = n->Next;
		}
		return n == NULL || n->IsNil() ? NULL : n;
	}